

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mandelbrot.c
# Opt level: O0

void render_task(parallel_task_2d *task,size_t thread_id)

{
  undefined1 local_30 [8];
  tile tile;
  render_task *render_task;
  size_t thread_id_local;
  parallel_task_2d *task_local;
  
  local_30._0_4_ = (undefined4)task->range[1].begin;
  local_30._4_4_ = (undefined4)task->range[0].begin;
  tile.i = (int)task->range[1].end;
  tile.j = (int)task->range[0].end;
  tile._8_8_ = task;
  render_tile((tile *)local_30,(global_data *)task[1].work_item.work_fn);
  return;
}

Assistant:

static void render_task(struct parallel_task_2d* task, size_t thread_id) {
    IGNORE(thread_id);
    struct render_task* render_task = (void*)task;
    struct tile tile = {
        .i = render_task->task.range[1].begin,
        .j = render_task->task.range[0].begin,
        .m = render_task->task.range[1].end,
        .n = render_task->task.range[0].end
    };
    render_tile(&tile, render_task->global_data);
}